

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O0

void __thiscall rsg::BlockStatement::BlockStatement(BlockStatement *this,GeneratorState *state)

{
  GeneratorState *state_local;
  BlockStatement *this_local;
  
  Statement::Statement(&this->super_Statement);
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__BlockStatement_0025a530;
  VariableScope::VariableScope(&this->m_scope);
  std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::vector(&this->m_children);
  init(this,(EVP_PKEY_CTX *)state);
  return;
}

Assistant:

BlockStatement::BlockStatement (GeneratorState& state)
{
	init(state);
}